

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_dpg.h
# Opt level: O0

void __thiscall
projects::dpg::
LoadElementVectorProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/convergence_study1.cc:46:14)>_>
::LoadElementVectorProvider
          (LoadElementVectorProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_dpg_convergence_studies_convergence_study1_cc:46:14)>_>
           *this,shared_ptr<projects::dpg::ProductUniformFESpace<double>_> *fe_space_test,
          size_type test_component,
          MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_dpg_convergence_studies_convergence_study1_cc:46:14)>
          *f)

{
  RefEl ref_el_00;
  int iVar1;
  uint uVar2;
  element_type *this_00;
  ScalarReferenceFiniteElement<double> *fe;
  reference this_01;
  QuadRule local_120;
  PrecomputedScalarReferenceFiniteElement<double> local_f0;
  RefElType local_79;
  ScalarReferenceFiniteElement<double> *local_78;
  ScalarReferenceFiniteElement<double> *fe_test;
  const_iterator pRStack_68;
  RefEl ref_el;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<lf::base::RefEl> local_50;
  initializer_list<lf::base::RefEl> *local_40;
  initializer_list<lf::base::RefEl> *__range2;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_dpg_convergence_studies_convergence_study1_cc:46:14)>
  *local_28;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_dpg_convergence_studies_convergence_study1_cc:46:14)>
  *f_local;
  shared_ptr<projects::dpg::ProductUniformFESpace<double>_> *psStack_18;
  size_type test_component_local;
  shared_ptr<projects::dpg::ProductUniformFESpace<double>_> *fe_space_test_local;
  LoadElementVectorProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_dpg_convergence_studies_convergence_study1_cc:46:14)>_>
  *this_local;
  
  local_28 = f;
  f_local._4_4_ = test_component;
  psStack_18 = fe_space_test;
  fe_space_test_local = (shared_ptr<projects::dpg::ProductUniformFESpace<double>_> *)this;
  SubElementVectorProvider<double>::SubElementVectorProvider
            (&this->super_SubElementVectorProvider<double>);
  (this->super_SubElementVectorProvider<double>)._vptr_SubElementVectorProvider =
       (_func_int **)&PTR__LoadElementVectorProvider_008a6bb0;
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/convergence_study1.cc:46:14)>
  ::MeshFunctionGlobal(&this->f_,f);
  memset(&this->fe_precomp_test_,0,0x230);
  std::array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL>::array
            (&this->fe_precomp_test_);
  this->test_component_ = f_local._4_4_;
  __begin2._6_1_ = lf::base::RefEl::kTria();
  __begin2._7_1_ = lf::base::RefEl::kQuad();
  local_50._M_array = (iterator)((long)&__begin2 + 6);
  local_50._M_len = 2;
  local_40 = &local_50;
  __end2 = std::initializer_list<lf::base::RefEl>::begin(local_40);
  pRStack_68 = std::initializer_list<lf::base::RefEl>::end(local_40);
  for (; __end2 != pRStack_68; __end2 = __end2 + 1) {
    fe_test._7_1_ = (RefEl)__end2->type_;
    this_00 = std::
              __shared_ptr_access<projects::dpg::ProductUniformFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<projects::dpg::ProductUniformFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)fe_space_test);
    local_79 = fe_test._7_1_;
    fe = ProductUniformFESpace<double>::ShapeFunctionLayout
                   (this_00,fe_test._7_1_,this->test_component_);
    ref_el_00.type_ = fe_test._7_1_;
    local_78 = fe;
    if (fe != (ScalarReferenceFiniteElement<double> *)0x0) {
      iVar1 = (*fe->_vptr_ScalarReferenceFiniteElement[3])();
      lf::quad::make_QuadRule(&local_120,ref_el_00,iVar1 * 2);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
      PrecomputedScalarReferenceFiniteElement(&local_f0,fe,&local_120);
      uVar2 = lf::base::RefEl::Id((RefEl *)((long)&fe_test + 7));
      this_01 = std::array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL>::
                operator[](&this->fe_precomp_test_,(ulong)uVar2);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::operator=(this_01,&local_f0);
      lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
      ~PrecomputedScalarReferenceFiniteElement(&local_f0);
      lf::quad::QuadRule::~QuadRule(&local_120);
    }
  }
  return;
}

Assistant:

LoadElementVectorProvider<SCALAR, FUNCTOR>::LoadElementVectorProvider(
    std::shared_ptr<ProductUniformFESpace<SCALAR>> fe_space_test,
    size_type test_component, FUNCTOR f)
    : f_(std::move(f)), test_component_(test_component), fe_precomp_test_() {
  for (auto ref_el : {lf::base::RefEl::kTria(), lf::base::RefEl::kQuad()}) {
    // obtain description of local shape function
    auto fe_test = fe_space_test->ShapeFunctionLayout(ref_el, test_component_);
    // check, that  shape functions for this component are available
    // Note that the corresponding PrecomputedScalarReferenceFiniteElement local
    // object is not initialized if the associated description of local shape
    // functions is missing.
    if (fe_test != nullptr) {
      // Precompute cell-independent quantities based on quadrature rules
      // with twice the degree of exactness compared to the degree of the
      // finite element space.
      fe_precomp_test_[ref_el.Id()] =
          lf::uscalfe::PrecomputedScalarReferenceFiniteElement(
              fe_test, lf::quad::make_QuadRule(ref_el, 2 * fe_test->Degree()));
    }
  }
}